

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

int number_of_parameter_constraints_in(CgreenVector *constraints)

{
  _Bool _Var1;
  int iVar2;
  CgreenVector *in_RDI;
  Constraint *constraint;
  int parameters;
  int i;
  CgreenVector *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = 0;
  while (iVar3 = local_c, iVar2 = cgreen_vector_size(in_RDI), iVar3 < iVar2) {
    cgreen_vector_get(in_stack_ffffffffffffffd8,0);
    _Var1 = is_comparing((Constraint *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
    if (_Var1) {
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  return local_10;
}

Assistant:

int number_of_parameter_constraints_in(const CgreenVector* constraints) {
    int i, parameters = 0;

    for (i = 0; i < cgreen_vector_size(constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(constraints, i);

        if (is_comparing(constraint)) {
           parameters++;
        }
    }

    return parameters;
}